

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

size_t __thiscall lattice::graph::add_site(graph *this,coordinate_t *pos,int tp)

{
  pointer pMVar1;
  invalid_argument *this_00;
  size_type sVar2;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_RDI;
  size_t s;
  value_type *__x;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff80;
  site_t *this_01;
  value_type *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffac;
  site_t *in_stack_ffffffffffffffb0;
  
  pMVar1 = (pointer)Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                              (in_stack_ffffffffffffff80);
  if (pMVar1 != (in_RDI->
                super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"dimension mismatch");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __x = (value_type *)
        &(in_RDI->
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  sVar2 = std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::size
                    ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)__x)
  ;
  this_01 = (site_t *)&stack0xffffffffffffff98;
  site_t::site_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::push_back
            ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)this_01,__x)
  ;
  site_t::~site_t(this_01);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::push_back(in_RDI,in_stack_ffffffffffffff88);
  return sVar2;
}

Assistant:

std::size_t add_site(const coordinate_t& pos, int tp) {
    if (std::size_t(pos.size()) != dim_)
      throw std::invalid_argument("dimension mismatch");
    std::size_t s = sites_.size();
    sites_.push_back(tp);
    coordinates_.push_back(pos);
    return s;
  }